

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

float ma_spatializer_get_doppler_factor(ma_spatializer *pSpatializer)

{
  ma_spatializer *pSpatializer_local;
  float local_18;
  ma_atomic_if32 r;
  
  if (pSpatializer == (ma_spatializer *)0x0) {
    local_18 = 1.0;
  }
  else {
    local_18 = pSpatializer->dopplerFactor;
  }
  return local_18;
}

Assistant:

MA_API float ma_spatializer_get_doppler_factor(const ma_spatializer* pSpatializer)
{
    if (pSpatializer == NULL) {
        return 1;
    }

    return ma_atomic_load_f32(&pSpatializer->dopplerFactor);
}